

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O2

binding_t * add_binding_to_tool(tool_t *tool,gotcha_binding_t *user_binding,int user_binding_size)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  binding_t *__ptr;
  internal_binding_t *data;
  long lVar4;
  long lVar5;
  char *__format;
  FILE *pFVar6;
  undefined8 uVar7;
  ulong uVar8;
  gotcha_binding_t *pgVar9;
  char *pcVar10;
  
  __ptr = (binding_t *)malloc(0x58);
  __ptr->tool = tool;
  data = (internal_binding_t *)malloc((long)user_binding_size << 5);
  lVar4 = 0;
  uVar8 = 0;
  if (0 < user_binding_size) {
    uVar8 = (ulong)(uint)user_binding_size;
  }
  pgVar9 = user_binding;
  for (; uVar8 << 5 != lVar4; lVar4 = lVar4 + 0x20) {
    *(gotcha_binding_t **)((long)&data->user_binding + lVar4) = pgVar9;
    *pgVar9->function_handle =
         (gotcha_wrappee_handle_t)((long)&data->associated_binding_table + lVar4);
    *(binding_t **)((long)&data->associated_binding_table + lVar4) = __ptr;
    pgVar9 = pgVar9 + 1;
  }
  __ptr->internal_bindings = data;
  __ptr->internal_bindings_size = user_binding_size;
  iVar1 = create_hashtable(&__ptr->binding_hash,(long)(user_binding_size * 2),strhash,strcmp);
  pFVar6 = _stderr;
  if (iVar1 == 0) {
    lVar4 = -0x18;
    do {
      lVar5 = lVar4;
      if (uVar8 * 0x18 - (lVar5 + 0x18) == 0) {
        __ptr->next_tool_binding = tool->binding;
        tool->binding = __ptr;
        __ptr->next_binding = all_bindings;
        pFVar6 = _stderr;
        if (debug_level < 2) {
          all_bindings = __ptr;
          return __ptr;
        }
        all_bindings = __ptr;
        uVar2 = gotcha_gettid();
        uVar3 = getpid();
        fprintf(pFVar6,"[%d/%d][%s:%u] - Created new binding table of size %d for tool %s\n",
                (ulong)uVar2,(ulong)uVar3,"tool.c",0x86,(ulong)(uint)user_binding_size,
                tool->tool_name);
        return __ptr;
      }
      iVar1 = addto_hashtable(&__ptr->binding_hash,
                              *(hash_key_t *)((long)&user_binding[1].name + lVar5),data);
      pFVar6 = _stderr;
      lVar4 = lVar5 + 0x18;
      data = data + 1;
    } while (iVar1 == 0);
    if (debug_level == 0) goto LAB_001046ce;
    uVar2 = gotcha_gettid();
    uVar3 = getpid();
    __format = "ERROR [%d/%d][%s:%u] - Could not add hash entry for %s to table for tool %s\n";
    uVar7 = 0x7b;
    pcVar10 = *(char **)((long)&user_binding[1].name + lVar5);
  }
  else {
    if (debug_level == 0) goto LAB_001046ce;
    uVar2 = gotcha_gettid();
    uVar3 = getpid();
    __format = "ERROR [%d/%d][%s:%u] - Could not create hash table for %s\n";
    uVar7 = 0x72;
    pcVar10 = tool->tool_name;
  }
  fprintf(pFVar6,__format,(ulong)uVar2,(ulong)uVar3,"tool.c",uVar7,pcVar10);
LAB_001046ce:
  free(__ptr);
  return (binding_t *)0x0;
}

Assistant:

binding_t *add_binding_to_tool(tool_t *tool, struct gotcha_binding_t *user_binding, int user_binding_size)
{
   binding_t *newbinding;
   int result, i;
   newbinding = (binding_t *) gotcha_malloc(sizeof(binding_t));
   newbinding->tool = tool;
   struct internal_binding_t* internal_bindings = (struct internal_binding_t*)gotcha_malloc(sizeof(struct internal_binding_t)*user_binding_size);
   for(i=0;i<user_binding_size;i++){
      internal_bindings[i].user_binding = &user_binding[i];
      *(user_binding[i].function_handle) = &internal_bindings[i];
      internal_bindings[i].associated_binding_table = newbinding;
   }  
   newbinding->internal_bindings = internal_bindings;
   newbinding->internal_bindings_size = user_binding_size;
   result = create_hashtable(&newbinding->binding_hash, user_binding_size * 2, 
                             (hash_func_t) strhash, (hash_cmp_t) gotcha_strcmp);
   if (result != 0) {
      error_printf("Could not create hash table for %s\n", tool->tool_name);
      goto error; // error is a label which frees allocated resources and returns NULL
   }

   for (i = 0; i < user_binding_size; i++) {
      result = addto_hashtable(&newbinding->binding_hash, (void *) user_binding[i].name,
                               (void *) (internal_bindings + i));
      if (result != 0) {
         error_printf("Could not add hash entry for %s to table for tool %s\n", 
                      user_binding[i].name, tool->tool_name);
         goto error; // error is a label which frees allocated resources and returns NULL
      }
   }

   newbinding->next_tool_binding = tool->binding;
   tool->binding = newbinding;

   newbinding->next_binding = all_bindings;
   all_bindings = newbinding;

   debug_printf(2, "Created new binding table of size %d for tool %s\n", user_binding_size, tool->tool_name);
   return newbinding;

  error:
   if (newbinding)
      gotcha_free(newbinding);
   return NULL;
}